

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O1

void __thiscall
slang::ast::SFormat::TypeVisitor::visit(TypeVisitor *this,EnumType *type,ConstantValue *arg)

{
  char *begin;
  bool bVar1;
  bool bVar2;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> this_00;
  ConstantValue *lhs;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  sVar3;
  string local_48;
  
  sVar3 = Scope::membersOfType<slang::ast::EnumValueSymbol>(&type->super_Scope);
  this_00 = sVar3._M_begin.current;
  do {
    bVar1 = this_00.current != sVar3._M_end.current.current;
    if (!bVar1) {
LAB_0089707c:
      ConstantValue::toString_abi_cxx11_(&local_48,arg,0x80,false,false);
      ::fmt::v11::detail::buffer<char>::append<char>
                ((buffer<char> *)&this->buffer,local_48._M_dataplus._M_p,
                 local_48._M_dataplus._M_p + local_48._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    lhs = EnumValueSymbol::getValue((EnumValueSymbol *)this_00.current,(SourceRange)ZEXT816(0));
    bVar2 = slang::operator==(lhs,arg);
    if (bVar2) {
      begin = (((EnumValueSymbol *)this_00.current)->super_ValueSymbol).super_Symbol.name._M_str;
      ::fmt::v11::detail::buffer<char>::append<char>
                ((buffer<char> *)&this->buffer,begin,
                 begin + (((EnumValueSymbol *)this_00.current)->super_ValueSymbol).super_Symbol.name
                         ._M_len);
      if (bVar1) {
        return;
      }
      goto LAB_0089707c;
    }
    do {
      this_00.current =
           (((EnumValueSymbol *)this_00.current)->super_ValueSymbol).super_Symbol.nextInScope;
      if ((EnumValueSymbol *)this_00.current == (EnumValueSymbol *)0x0) break;
    } while ((((EnumValueSymbol *)this_00.current)->super_ValueSymbol).super_Symbol.kind !=
             EnumValue);
  } while( true );
}

Assistant:

void visit(const EnumType& type, const ConstantValue& arg) {
        for (auto& member : type.values()) {
            if (member.getValue() == arg) {
                buffer.append(member.name);
                return;
            }
        }
        buffer.append(arg.toString());
    }